

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVProcessChain.cxx
# Opt level: O2

bool checkOutput(istream *outputStream,istream *errorStream)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  string error;
  string output;
  
  getInput_abi_cxx11_(&output,outputStream);
  bVar1 = std::operator!=(&output,"HELO WRD!");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Output was \"");
    poVar2 = std::operator<<(poVar2,(string *)&output);
    poVar2 = std::operator<<(poVar2,"\", expected \"HELO WRD!\"");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = false;
    goto LAB_001bbce6;
  }
  getInput_abi_cxx11_(&error,errorStream);
  lVar3 = std::__cxx11::string::find((char *)&error,0x76e9ef);
  if (lVar3 != -1) {
    std::__cxx11::string::resize((ulong)&error);
  }
  if (error._M_string_length == 3) {
    lVar3 = std::__cxx11::string::find((char)&error,0x31);
    if (lVar3 == -1) goto LAB_001bbca3;
    lVar3 = std::__cxx11::string::find((char)&error,0x32);
    if (lVar3 == -1) goto LAB_001bbca3;
    lVar3 = std::__cxx11::string::find((char)&error,0x33);
    bVar1 = true;
    if (lVar3 == -1) goto LAB_001bbca3;
  }
  else {
LAB_001bbca3:
    poVar2 = std::operator<<((ostream *)&std::cout,"Error was \"");
    poVar2 = std::operator<<(poVar2,(string *)&error);
    poVar2 = std::operator<<(poVar2,"\", expected \"123\"");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&error);
LAB_001bbce6:
  std::__cxx11::string::~string((string *)&output);
  return bVar1;
}

Assistant:

static bool checkOutput(std::istream& outputStream, std::istream& errorStream)
{
  std::string output = getInput(outputStream);
  if (output != "HELO WRD!") {
    std::cout << "Output was \"" << output << "\", expected \"HELO WRD!\""
              << std::endl;
    return false;
  }

  std::string error = getInput(errorStream);
  auto qemu_error_pos = error.find("qemu:");
  if (qemu_error_pos != std::string::npos) {
    error.resize(qemu_error_pos);
  }
  if (error.length() != 3 || error.find('1') == std::string::npos ||
      error.find('2') == std::string::npos ||
      error.find('3') == std::string::npos) {
    std::cout << "Error was \"" << error << "\", expected \"123\""
              << std::endl;
    return false;
  }

  return true;
}